

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O2

void __thiscall
soul::ArrayWithPreallocation<soul::pool_ptr<soul::AST::Constant>,_4UL>::resize
          (ArrayWithPreallocation<soul::pool_ptr<soul::AST::Constant>,_4UL> *this,size_t newSize)

{
  pool_ptr<soul::AST::Constant> *ppVar1;
  ulong uVar2;
  
  if (this->numActive < newSize) {
    reserve(this,newSize);
    ppVar1 = this->items;
    uVar2 = this->numActive;
    while (uVar2 < newSize) {
      this->numActive = uVar2 + 1;
      ppVar1[uVar2].object = (Constant *)0x0;
      uVar2 = uVar2 + 1;
    }
    return;
  }
  shrink(this,newSize);
  return;
}

Assistant:

void resize (size_t newSize)
    {
        if (newSize > numActive)
        {
            reserve (newSize);

            while (numActive < newSize)
                new (items + numActive++) Item (Item());
        }
        else
        {
            shrink (newSize);
        }
    }